

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

vorbis_info * ov_info(OggVorbis_File *vf,int link)

{
  vorbis_info *pvVar1;
  
  if (vf->seekable == 0) {
    pvVar1 = vf->vi;
  }
  else {
    if (-1 < link) {
      if (link < vf->links) {
        return vf->vi + (uint)link;
      }
      return (vorbis_info *)0x0;
    }
    pvVar1 = vf->vi;
    if (2 < vf->ready_state) {
      return pvVar1 + vf->current_link;
    }
  }
  return pvVar1;
}

Assistant:

vorbis_info *ov_info(OggVorbis_File *vf,int link){
  if(vf->seekable){
    if(link<0)
      if(vf->ready_state>=STREAMSET)
        return vf->vi+vf->current_link;
      else
      return vf->vi;
    else
      if(link>=vf->links)
        return NULL;
      else
        return vf->vi+link;
  }else{
    return vf->vi;
  }
}